

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O1

int Gia_Truth6ToGia(Gia_Man_t *p,int *pVarLits,int nVars,word Truth,int fHash)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (Truth == 0) {
    iVar1 = 0;
  }
  else {
    if (Truth != 0xffffffffffffffff) {
      if (nVars < 1) {
        __assert_fail("nVars > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                      ,0xb6,"int Gia_Truth6ToGia(Gia_Man_t *, int *, int, word, int)");
      }
      uVar5 = (ulong)(uint)nVars;
      iVar1 = nVars + -1;
      do {
        iVar2 = iVar1;
        uVar4 = uVar5;
        if ((long)uVar4 < 1) {
          __assert_fail("Var >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                        ,0xbb,"int Gia_Truth6ToGia(Gia_Man_t *, int *, int, word, int)");
        }
        bVar3 = (byte)(1 << ((byte)iVar2 & 0x1f));
        uVar5 = uVar4 - 1;
        iVar1 = iVar2 + -1;
      } while ((s_Truths6[uVar4 + 5] & (Truth >> (bVar3 & 0x3f) ^ Truth)) == 0);
      if ((long)uVar4 < 7) {
        uVar5 = uVar4 - 1 & 0xffffffff;
        iVar1 = Gia_Truth6ToGia(p,pVarLits,iVar2,
                                (s_Truths6Neg[uVar5] & Truth) << (bVar3 & 0x3f) |
                                s_Truths6Neg[uVar5] & Truth,fHash);
        iVar2 = Gia_Truth6ToGia(p,pVarLits,iVar2,
                                (Truth & s_Truths6[uVar5]) >> (bVar3 & 0x3f) |
                                Truth & s_Truths6[uVar5],fHash);
        if (fHash != 0) {
          iVar1 = Gia_ManHashMux(p,pVarLits[uVar5],iVar2,iVar1);
          return iVar1;
        }
        iVar1 = Gia_ManAppendMux(p,pVarLits[uVar5],iVar2,iVar1);
        return iVar1;
      }
      __assert_fail("iVar >= 0 && iVar < 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x337,"word Abc_Tt6Cofactor0(word, int)");
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Gia_Truth6ToGia( Gia_Man_t * p, int * pVarLits, int nVars, word Truth, int fHash )
{
    int Var, Lit0, Lit1; 
    if ( Truth == 0 )
        return 0;
    if ( ~Truth == 0 )
        return 1;
    assert( nVars > 0 );
    // find the topmost var
    for ( Var = nVars-1; Var >= 0; Var-- )
        if ( Abc_Tt6HasVar( Truth, Var ) )
             break;
    assert( Var >= 0 );
    // cofactor
    Lit0 = Gia_Truth6ToGia( p, pVarLits, Var, Abc_Tt6Cofactor0(Truth, Var), fHash );
    Lit1 = Gia_Truth6ToGia( p, pVarLits, Var, Abc_Tt6Cofactor1(Truth, Var), fHash );
    if ( fHash )
        return Gia_ManHashMux( p, pVarLits[Var], Lit1, Lit0 );
    else
        return Gia_ManAppendMux( p, pVarLits[Var], Lit1, Lit0 );
}